

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

void refineBasis(HighsLp *lp,HighsSolution *solution,HighsBasis *basis)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  HighsBasisStatus HVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  bVar3 = solution->value_valid;
  uVar8 = 0;
  uVar9 = (ulong)(uint)lp->num_col_;
  if (lp->num_col_ < 1) {
    uVar9 = uVar8;
  }
  uVar4 = lp->num_row_;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    if ((basis->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar8] == kNonbasic) {
      dVar10 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      dVar2 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      if ((dVar10 != dVar2) || (NAN(dVar10) || NAN(dVar2))) {
        bVar5 = highs_isInfinity(-dVar10);
        bVar6 = highs_isInfinity(dVar2);
        if (bVar5) {
          HVar7 = bVar6 | kUpper;
        }
        else {
          if (bVar6) goto LAB_0026fd94;
          if (bVar3 == false) {
            bVar5 = ABS(dVar2) == ABS(dVar10);
            bVar6 = ABS(dVar2) < ABS(dVar10);
          }
          else {
            dVar10 = (dVar10 + dVar2) * 0.5;
            pdVar1 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar8;
            bVar5 = dVar10 == *pdVar1;
            bVar6 = dVar10 < *pdVar1;
          }
          HVar7 = (bVar6 || bVar5) * '\x02';
        }
      }
      else {
LAB_0026fd94:
        HVar7 = kLower;
      }
      (basis->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar8] = HVar7;
    }
  }
  uVar8 = 0;
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar8;
  }
  do {
    if (uVar9 == uVar8) {
      return;
    }
    if ((basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar8] == kNonbasic) {
      dVar10 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      dVar2 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      if ((dVar10 != dVar2) || (NAN(dVar10) || NAN(dVar2))) {
        bVar5 = highs_isInfinity(-dVar10);
        bVar6 = highs_isInfinity(dVar2);
        if (bVar5) {
          HVar7 = bVar6 | kUpper;
        }
        else {
          if (bVar6) goto LAB_0026fe6d;
          if (bVar3 == false) {
            bVar5 = ABS(dVar2) == ABS(dVar10);
            bVar6 = ABS(dVar2) < ABS(dVar10);
          }
          else {
            dVar10 = (dVar10 + dVar2) * 0.5;
            pdVar1 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar8;
            bVar5 = dVar10 == *pdVar1;
            bVar6 = dVar10 < *pdVar1;
          }
          HVar7 = (bVar6 || bVar5) * '\x02';
        }
      }
      else {
LAB_0026fe6d:
        HVar7 = kLower;
      }
      (basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar8] = HVar7;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void refineBasis(const HighsLp& lp, const HighsSolution& solution,
                 HighsBasis& basis) {
  assert(basis.useful);
  assert(isBasisRightSize(lp, basis));
  const bool have_highs_solution = solution.value_valid;

  const HighsInt num_col = lp.num_col_;
  const HighsInt num_row = lp.num_row_;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.col_lower_[iCol];
    const double upper = lp.col_upper_[iCol];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.col_value[iCol] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.col_status[iCol] = status;
  }

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.row_lower_[iRow];
    const double upper = lp.row_upper_[iRow];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.row_value[iRow] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.row_status[iRow] = status;
  }
}